

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

void CChat::Com_Mute(IResult *pResult,void *pContext)

{
  bool *pbVar1;
  bool bVar2;
  long lVar3;
  CChat *this;
  CGameClient *pCVar4;
  int iVar5;
  undefined4 extraout_var;
  char *pcVar6;
  long in_FS_OFFSET;
  char aMsg [128];
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this = *(CChat **)((long)pContext + 0x18);
  pCVar4 = (this->super_CComponent).m_pClient;
  iVar5 = (*pResult->_vptr_IResult[4])(pResult,0);
  iVar5 = CGameClient::GetClientID(pCVar4,(char *)CONCAT44(extraout_var,iVar5));
  if (iVar5 != -1) {
    pCVar4 = (this->super_CComponent).m_pClient;
    bVar2 = pCVar4->m_aClients[iVar5].m_ChatIgnore;
    (*(pCVar4->m_pBlacklist->super_IInterface)._vptr_IInterface[(ulong)bVar2 + 4])
              (pCVar4->m_pBlacklist,pCVar4->m_aClients + iVar5);
    pbVar1 = &((this->super_CComponent).m_pClient)->m_aClients[iVar5].m_ChatIgnore;
    *pbVar1 = (bool)(*pbVar1 ^ 1);
    ClearInput(this);
    pcVar6 = "\'%s\' was muted";
    if (bVar2 != false) {
      pcVar6 = "\'%s\' was unmuted";
    }
    pcVar6 = Localize(pcVar6,"");
    str_format(aMsg,0x80,pcVar6,((this->super_CComponent).m_pClient)->m_aClients + iVar5);
    AddLine(this,aMsg,-2,1,-1);
  }
  Disable(this);
  (*(((this->super_CComponent).m_pClient)->super_IGameClient).super_IInterface._vptr_IInterface
    [0x17])();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CChat::Com_Mute(IConsole::IResult *pResult, void *pContext)
{
	CCommandManager::SCommandContext *pCommandContext = (CCommandManager::SCommandContext *)pContext;
	CChat *pChatData = (CChat *)pCommandContext->m_pContext;

	int TargetID = pChatData->m_pClient->GetClientID(pResult->GetString(0));
	if(TargetID != -1)
	{
		bool isMuted = pChatData->m_pClient->m_aClients[TargetID].m_ChatIgnore;
		if(isMuted)
			pChatData->m_pClient->Blacklist()->RemoveIgnoredPlayer(pChatData->m_pClient->m_aClients[TargetID].m_aName, pChatData->m_pClient->m_aClients[TargetID].m_aClan);
		else
			pChatData->m_pClient->Blacklist()->AddIgnoredPlayer(pChatData->m_pClient->m_aClients[TargetID].m_aName, pChatData->m_pClient->m_aClients[TargetID].m_aClan);
		pChatData->m_pClient->m_aClients[TargetID].m_ChatIgnore ^= 1;

		pChatData->ClearInput();

		char aMsg[128];
		str_format(aMsg, sizeof(aMsg), !isMuted ? Localize("'%s' was muted") : Localize("'%s' was unmuted"), pChatData->m_pClient->m_aClients[TargetID].m_aName);
		pChatData->AddLine(aMsg, CLIENT_MSG, CHAT_ALL);
	}
	pChatData->Disable();
	pChatData->m_pClient->OnRelease();
}